

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O3

void modifyChannels<float>
               (list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *channels,
               float delta)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  long lVar3;
  _List_node_base *p_Var4;
  long lVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  
  for (p_Var4 = (channels->
                super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var4 != (_List_node_base *)channels;
      p_Var4 = (((_List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *)
                &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    p_Var1 = p_Var4[1]._M_next;
    if (0 < (long)p_Var1) {
      p_Var2 = p_Var4[1]._M_prev;
      lVar5 = 0;
      p_Var6 = (_List_node_base *)0x0;
      do {
        if (0 < (long)p_Var2) {
          lVar3 = *(long *)(p_Var4 + 1 + 1);
          p_Var7 = (_List_node_base *)0x0;
          do {
            *(float *)(lVar3 + (long)p_Var7 * 4 + lVar5) =
                 *(float *)(lVar3 + (long)p_Var7 * 4 + lVar5) + delta;
            p_Var7 = (_List_node_base *)((long)&p_Var7->_M_next + 1);
          } while (p_Var2 != p_Var7);
        }
        p_Var6 = (_List_node_base *)((long)&p_Var6->_M_next + 1);
        lVar5 = lVar5 + (long)p_Var2 * 4;
      } while (p_Var6 != p_Var1);
    }
  }
  return;
}

Assistant:

void
modifyChannels (list<Array2D<T>>& channels, T delta)
{
    //
    // Dummy code modifying each pixel by incrementing every channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                channel[y][x] += delta;
            }
        }
    }
}